

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,unsigned_char>
               (char *input_str,uchar *result)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  undefined1 in_R8B;
  string_t input;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 local_1c;
  
  sVar3 = strlen(input_str);
  uVar2 = (uint)sVar3;
  if (uVar2 < 0xd) {
    local_1c = 0;
    uStack_24 = 0;
    uStack_20 = 0;
    if (uVar2 == 0) {
      input_str = (char *)0x0;
    }
    else {
      switchD_015de399::default(&uStack_24,input_str,(ulong)(uVar2 & 0xf));
      input_str = (char *)CONCAT44(local_1c,uStack_20);
    }
  }
  else {
    uStack_24 = *(undefined4 *)input_str;
  }
  input.value.pointer.ptr = (char *)result;
  input.value._0_8_ = input_str;
  bVar1 = TryCast::Operation<duckdb::string_t,unsigned_char>
                    ((TryCast *)CONCAT44(uStack_24,uVar2),input,(uint8_t *)0x0,(bool)in_R8B);
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}